

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O0

bool __thiscall ccs::CcsContext::get<bool>(CcsContext *this,string *propertyName,bool *defaultVal)

{
  bool bVar1;
  bool local_59 [8];
  bool t;
  undefined1 local_48 [8];
  string str;
  bool *defaultVal_local;
  string *propertyName_local;
  CcsContext *this_local;
  
  str.field_2._8_8_ = defaultVal;
  std::__cxx11::string::string((string *)local_48);
  bVar1 = getInto(this,(string *)local_48,propertyName);
  if (bVar1) {
    bVar1 = coerceString<bool>((string *)local_48,local_59);
    if (bVar1) {
      this_local._7_1_ = (bool)(local_59[0] & 1);
    }
    else {
      this_local._7_1_ = (bool)(*(byte *)str.field_2._8_8_ & 1);
    }
  }
  else {
    this_local._7_1_ = (bool)(*(byte *)str.field_2._8_8_ & 1);
  }
  local_59[1] = true;
  local_59[2] = false;
  local_59[3] = false;
  local_59[4] = false;
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

T CcsContext::get(const std::string &propertyName, const T &defaultVal) const {
  std::string str;
  if (!getInto(str, propertyName)) return defaultVal;
  T t;
  if (!coerceString(str, t)) return defaultVal;
  return t;
}